

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

void xmlFARegExecSave(xmlRegExecCtxtPtr exec)

{
  int iVar1;
  int iVar2;
  xmlRegExecRollback *pxVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  
  if (10000000 < exec->nbPush) {
    exec->status = -6;
    return;
  }
  exec->nbPush = exec->nbPush + 1;
  iVar1 = exec->nbRollbacks;
  iVar2 = exec->maxRollbacks;
  if (iVar1 < iVar2) {
LAB_0017d1ae:
    pxVar3 = exec->rollbacks;
    iVar1 = exec->nbRollbacks;
    pxVar3[iVar1].state = exec->state;
    pxVar3[iVar1].index = exec->index;
    pxVar3[iVar1].nextbranch = exec->transno + 1;
    lVar7 = (long)exec->comp->nbCounters;
    if (0 < lVar7) {
      if (pxVar3[iVar1].counts == (int *)0x0) {
        piVar4 = (int *)(*xmlMalloc)(lVar7 << 2);
        exec->rollbacks[exec->nbRollbacks].counts = piVar4;
        if (piVar4 == (int *)0x0) goto LAB_0017d235;
      }
      memcpy(exec->rollbacks[exec->nbRollbacks].counts,exec->counts,
             (long)exec->comp->nbCounters << 2);
    }
    exec->nbRollbacks = exec->nbRollbacks + 1;
  }
  else {
    if (iVar2 < 1) {
      uVar6 = 4;
    }
    else {
      uVar6 = 0xffffffff;
      if (iVar2 < 1000000000) {
        uVar5 = iVar2 + 1U >> 1;
        uVar6 = uVar5 + iVar2;
        if ((int)(1000000000 - uVar5) < iVar2) {
          uVar6 = 1000000000;
        }
      }
    }
    if ((-1 < (int)uVar6) &&
       (pxVar3 = (xmlRegExecRollback *)(*xmlRealloc)(exec->rollbacks,(ulong)uVar6 * 0x18),
       pxVar3 != (xmlRegExecRollback *)0x0)) {
      exec->rollbacks = pxVar3;
      exec->maxRollbacks = uVar6;
      memset(pxVar3 + iVar1,0,(long)(int)(uVar6 - iVar1) * 0x18);
      goto LAB_0017d1ae;
    }
LAB_0017d235:
    exec->status = -5;
  }
  return;
}

Assistant:

static void
xmlFARegExecSave(xmlRegExecCtxtPtr exec) {
#ifdef MAX_PUSH
    if (exec->nbPush > MAX_PUSH) {
        exec->status = XML_REGEXP_INTERNAL_LIMIT;
        return;
    }
    exec->nbPush++;
#endif

    if (exec->nbRollbacks >= exec->maxRollbacks) {
	xmlRegExecRollback *tmp;
        int newSize;
	int len = exec->nbRollbacks;

        newSize = xmlGrowCapacity(exec->maxRollbacks, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
	if (newSize < 0) {
            exec->status = XML_REGEXP_OUT_OF_MEMORY;
	    return;
	}
	tmp = xmlRealloc(exec->rollbacks, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
            exec->status = XML_REGEXP_OUT_OF_MEMORY;
	    return;
	}
	exec->rollbacks = tmp;
	exec->maxRollbacks = newSize;
	tmp = &exec->rollbacks[len];
	memset(tmp, 0, (exec->maxRollbacks - len) * sizeof(xmlRegExecRollback));
    }
    exec->rollbacks[exec->nbRollbacks].state = exec->state;
    exec->rollbacks[exec->nbRollbacks].index = exec->index;
    exec->rollbacks[exec->nbRollbacks].nextbranch = exec->transno + 1;
    if (exec->comp->nbCounters > 0) {
	if (exec->rollbacks[exec->nbRollbacks].counts == NULL) {
	    exec->rollbacks[exec->nbRollbacks].counts = (int *)
		xmlMalloc(exec->comp->nbCounters * sizeof(int));
	    if (exec->rollbacks[exec->nbRollbacks].counts == NULL) {
		exec->status = XML_REGEXP_OUT_OF_MEMORY;
		return;
	    }
	}
	memcpy(exec->rollbacks[exec->nbRollbacks].counts, exec->counts,
	       exec->comp->nbCounters * sizeof(int));
    }
    exec->nbRollbacks++;
}